

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O1

MPP_RET store_picture_in_dpb(H264_DpbBuf_t *p_Dpb,H264_StorePic_t *p)

{
  uint uVar1;
  H264dVideoCtx_t *p_Vid;
  H264_DpbMark_t *p_mark;
  h264_dec_ctx_t *phVar2;
  h264d_video_ctx_t *phVar3;
  h264_drpm_t *phVar4;
  H264_DecCtx_t *p_Dec;
  h264_store_pic_t *phVar5;
  h264_store_pic_t *phVar6;
  MPP_RET MVar7;
  RK_U32 RVar8;
  RK_S32 RVar9;
  MPP_RET MVar10;
  h264_frame_store_t *phVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  char *fmt;
  int iVar15;
  ulong uVar16;
  h264_store_pic_t *phVar17;
  H264_FrameStore_t *pHVar18;
  H264_StorePic_t *p_00;
  int iVar19;
  ulong uVar20;
  undefined8 uVar21;
  int iVar22;
  bool bVar23;
  bool bVar24;
  RK_S32 min_poc;
  RK_S32 min_pos;
  int local_40;
  RK_S32 local_34;
  
  p_Vid = p_Dpb->p_Vid;
  if (p == (H264_StorePic_t *)0x0) {
    MVar7 = MPP_ERR_VALUE;
    if (((byte)h264d_debug & 4) == 0) goto LAB_00193313;
    pcVar14 = "value error(%d).\n";
    uVar21 = 0x59d;
  }
  else {
    pcVar14 = (char *)p;
    if (p->mem_mark == (h264_dpb_mark_t *)0x0) {
LAB_0019324f:
      if (((byte)h264d_debug & 1) != 0) {
        pcVar14 = "h264d_dpb";
        _mpp_log_l(4,"h264d_dpb","error, p->mem_mark == NULL",(char *)0x0);
      }
    }
    else {
      uVar1 = p->mem_mark->slot_idx;
      pcVar14 = (char *)(ulong)uVar1;
      if ((int)uVar1 < 0) goto LAB_0019324f;
      mpp_buf_slot_set_flag(p_Vid->p_Dec->frame_slots,uVar1,SLOT_CODEC_USE);
    }
    p_Vid->last_has_mmco_5 = 0;
    p_Vid->last_pic_bottom_field = (uint)(p->structure == 2);
    if (p->idr_flag == 0) {
      if ((p->used_for_reference != 0) && (p->adaptive_ref_pic_buffering_flag != 0)) {
        phVar3 = p_Dpb->p_Vid;
        phVar3->last_has_mmco_5 = 0;
        phVar4 = p->dec_ref_pic_marking_buffer;
        while (phVar4 != (h264_drpm_t *)0x0) {
          switch(phVar4->memory_management_control_operation) {
          case 0:
            if (phVar4->Next != (h264_drpm_t *)0x0) {
              MVar7 = MPP_ERR_VALUE;
              if (((byte)h264d_debug & 4) == 0) goto LAB_00193c10;
              pcVar14 = "value error(%d).\n";
              uVar21 = 0x42d;
              goto LAB_001941a0;
            }
            break;
          case 1:
            RVar8 = p->frame_num * 2 + 1;
            if (p->structure == 3) {
              RVar8 = p->frame_num;
            }
            if ((ulong)p_Dpb->ref_frames_in_buffer != 0) {
              iVar15 = RVar8 + ~phVar4->difference_of_pic_nums_minus1;
              pcVar14 = (char *)p_Dpb->fs_ref;
              uVar16 = 0;
              do {
                p_Dec = *(H264_DecCtx_t **)(&((h264_store_pic_t *)pcVar14)->structure + uVar16 * 2);
                uVar1 = *(uint *)((long)&p_Dec->mem + 4);
                if (p->structure != 3) {
                  if ((((uVar1 & 1) == 0) || (((ulong)p_Dec->dpb_mark & 1) != 0)) ||
                     (*(int *)(*(long *)&p_Dec->next_state + 0x18) != iVar15)) {
                    if ((((uVar1 & 2) == 0) || (((ulong)p_Dec->dpb_mark & 2) != 0)) ||
                       (*(int *)(*(long *)&p_Dec->mvc_valid + 0x18) != iVar15)) goto LAB_001935ff;
                    *(undefined4 *)(*(long *)&p_Dec->mvc_valid + 0x2c) = 0;
                    *(uint *)((long)&p_Dec->mem + 4) = uVar1 & 1;
                  }
                  else {
                    *(undefined4 *)(*(long *)&p_Dec->next_state + 0x2c) = 0;
                    *(uint *)((long)&p_Dec->mem + 4) = uVar1 & 2;
                  }
                  if (*(int *)&p_Dec->mem == 3) {
                    *(undefined4 *)(*(long *)&p_Dec->spt_decode_mtds + 0x2c) = 0;
                  }
                  break;
                }
                if (((uVar1 == 3) && (*(int *)&p_Dec->dpb_mark == 0)) &&
                   (*(int *)(*(long *)&p_Dec->spt_decode_mtds + 0x18) == iVar15)) {
                  unmark_for_reference(p_Dec,(H264_FrameStore_t *)pcVar14);
                  break;
                }
LAB_001935ff:
                uVar16 = uVar16 + 1;
              } while (p_Dpb->ref_frames_in_buffer != uVar16);
            }
            update_ref_list(p_Dpb);
            break;
          case 2:
            if (p_Dpb->ltref_frames_in_buffer != 0) {
              iVar15 = phVar4->long_term_pic_num;
              uVar16 = 0;
              do {
                pHVar18 = p_Dpb->fs_ltref[uVar16];
                uVar1 = pHVar18->is_reference;
                if (p->structure != 3) {
                  if ((((uVar1 & 1) == 0) || (uVar12 = pHVar18->is_long_term, (uVar12 & 1) == 0)) ||
                     (pcVar14 = (char *)pHVar18->top_field,
                     ((h264_store_pic_t *)pcVar14)->long_term_pic_num != iVar15)) {
                    if ((((uVar1 & 2) == 0) || (uVar12 = pHVar18->is_long_term, (uVar12 & 2) == 0))
                       || (phVar17 = pHVar18->bottom_field, phVar17->long_term_pic_num != iVar15))
                    goto LAB_0019351c;
                    phVar17->used_for_reference = 0;
                    phVar17->is_long_term = '\0';
                    pHVar18->is_reference = uVar1 & 1;
                    pHVar18->is_long_term = uVar12 & 1;
                  }
                  else {
                    ((h264_store_pic_t *)pcVar14)->used_for_reference = 0;
                    ((h264_store_pic_t *)pcVar14)->is_long_term = '\0';
                    pHVar18->is_reference = uVar1 & 2;
                    pHVar18->is_long_term = uVar12 & 2;
                  }
                  if (pHVar18->is_used == 3) {
                    phVar17 = pHVar18->frame;
                    phVar17->used_for_reference = 0;
                    phVar17->is_long_term = '\0';
                  }
                  break;
                }
                if (((uVar1 == 3) && (pHVar18->is_long_term == 3)) &&
                   (pHVar18->frame->long_term_pic_num == iVar15)) {
                  unmark_for_long_term_reference(pHVar18);
                }
LAB_0019351c:
                uVar16 = uVar16 + 1;
              } while (uVar16 < p_Dpb->ltref_frames_in_buffer);
            }
            update_ltref_list(p_Dpb);
            break;
          case 3:
            RVar8 = p->frame_num * 2 + 1;
            if (p->structure == 3) {
              RVar8 = p->frame_num;
            }
            uVar1 = phVar4->long_term_frame_idx;
            phVar17 = (h264_store_pic_t *)(ulong)uVar1;
            iVar15 = ~phVar4->difference_of_pic_nums_minus1 + RVar8;
            if (p->structure == 3) {
              pcVar14 = (char *)phVar17;
              unmark_long_term_frame_for_reference_by_frame_idx(p_Dpb,uVar1);
LAB_001937df:
              if (p->structure == 1) {
                iVar13 = 0;
                iVar22 = 1;
LAB_0019385f:
                if ((ulong)p_Dpb->ref_frames_in_buffer != 0) {
                  uVar16 = 0;
                  do {
                    phVar11 = p_Dpb->fs_ref[uVar16];
                    uVar12 = phVar11->is_reference;
                    pcVar14 = (char *)(ulong)uVar12;
                    if ((((uVar12 & 1) != 0) && (phVar11->top_field->is_long_term == '\0')) &&
                       (phVar11->top_field->pic_num == iVar15)) {
                      if (((phVar11->is_long_term != 0) && (phVar11->long_term_frame_idx != uVar1))
                         && (((byte)h264d_debug & 4) != 0)) {
                        _mpp_log_l(4,"h264d_dpb",
                                   "assigning long_term_frame_idx different from other field.",
                                   (char *)0x0);
                      }
                      phVar11 = p_Dpb->fs_ref[uVar16];
                      phVar5 = phVar11->top_field;
                      phVar5->long_term_frame_idx = uVar1;
                      phVar11->long_term_frame_idx = uVar1;
                      phVar5->long_term_pic_num = iVar22 + uVar1 * 2;
                      phVar5->is_long_term = '\x01';
                      uVar12 = phVar11->is_long_term | 1;
                      phVar11->is_long_term = uVar12;
joined_r0x00193a0c:
                      pcVar14 = (char *)phVar17;
                      if (uVar12 == 3) {
                        phVar5 = phVar11->frame;
                        phVar5->is_long_term = '\x01';
                        phVar5->long_term_pic_num = uVar1;
                        phVar5->long_term_frame_idx = uVar1;
                      }
                      goto LAB_001938e3;
                    }
                    if ((((uVar12 & 2) != 0) &&
                        (pcVar14 = (char *)phVar11->bottom_field,
                        ((h264_store_pic_t *)pcVar14)->is_long_term == '\0')) &&
                       (((h264_store_pic_t *)pcVar14)->pic_num == iVar15)) {
                      if (((phVar11->is_long_term != 0) && (phVar11->long_term_frame_idx != uVar1))
                         && (((byte)h264d_debug & 4) != 0)) {
                        _mpp_log_l(4,"h264d_dpb",
                                   "assigning long_term_frame_idx different from other field.",
                                   (char *)0x0);
                      }
                      phVar11 = p_Dpb->fs_ref[uVar16];
                      phVar5 = phVar11->bottom_field;
                      phVar5->long_term_frame_idx = uVar1;
                      phVar11->long_term_frame_idx = uVar1;
                      phVar5->long_term_pic_num = iVar13 + uVar1 * 2;
                      phVar5->is_long_term = '\x01';
                      uVar12 = phVar11->is_long_term | 2;
                      phVar11->is_long_term = uVar12;
                      goto joined_r0x00193a0c;
                    }
                    uVar16 = uVar16 + 1;
                  } while (p_Dpb->ref_frames_in_buffer != uVar16);
                }
                if (((byte)h264d_debug & 4) == 0) goto LAB_001938e3;
                fmt = "reference field for long term marking not found.";
              }
              else {
                if (p->structure != 3) {
                  iVar13 = 1;
                  iVar22 = 0;
                  goto LAB_0019385f;
                }
                if ((h264_store_pic_t *)(ulong)p_Dpb->ref_frames_in_buffer !=
                    (h264_store_pic_t *)0x0) {
                  pcVar14 = (char *)0x0;
                  do {
                    phVar11 = p_Dpb->fs_ref[(long)pcVar14];
                    if (((phVar11->is_reference == 3) &&
                        (phVar5 = phVar11->frame, phVar5->is_long_term == '\0')) &&
                       (phVar5->pic_num == iVar15)) {
                      phVar5->long_term_frame_idx = uVar1;
                      phVar11->long_term_frame_idx = uVar1;
                      phVar5->long_term_pic_num = uVar1;
                      phVar5->is_long_term = '\x01';
                      phVar5 = phVar11->top_field;
                      if ((phVar5 != (h264_store_pic_t *)0x0) &&
                         (phVar6 = phVar11->bottom_field, phVar6 != (h264_store_pic_t *)0x0)) {
                        phVar6->long_term_frame_idx = uVar1;
                        phVar5->long_term_frame_idx = uVar1;
                        phVar5->long_term_pic_num = uVar1;
                        phVar6->long_term_pic_num = uVar1;
                        phVar17 = (h264_store_pic_t *)CONCAT71((uint7)(uint3)(uVar1 >> 8),1);
                        phVar6->is_long_term = '\x01';
                        phVar5->is_long_term = '\x01';
                      }
                      phVar11->is_long_term = 3;
                      pcVar14 = (char *)phVar17;
                      goto LAB_001938e3;
                    }
                    pcVar14 = (char *)((long)&((h264_store_pic_t *)pcVar14)->structure + 1);
                  } while ((h264_store_pic_t *)(ulong)p_Dpb->ref_frames_in_buffer !=
                           (h264_store_pic_t *)pcVar14);
                }
                if (((byte)h264d_debug & 4) == 0) goto LAB_001938e3;
                fmt = "reference frame for long term marking not found.";
              }
              pcVar14 = "h264d_dpb";
              _mpp_log_l(4,"h264d_dpb",fmt,(char *)0x0);
            }
            else {
              uVar16 = (ulong)p_Dpb->ref_frames_in_buffer;
              pcVar14 = (char *)0x3;
              bVar23 = uVar16 != 0;
              if (bVar23) {
                bVar23 = true;
                uVar20 = 1;
                do {
                  phVar11 = p_Dpb->fs_ref[uVar20 - 1];
                  if (((phVar11->is_reference & 1U) != 0) && (phVar11->top_field->pic_num == iVar15)
                     ) {
                    pcVar14 = (char *)0x1;
                    break;
                  }
                  if (((phVar11->is_reference & 2U) != 0) &&
                     (phVar11->bottom_field->pic_num == iVar15)) {
                    pcVar14 = (char *)0x2;
                    break;
                  }
                  bVar23 = uVar20 < uVar16;
                  bVar24 = uVar20 != uVar16;
                  uVar20 = uVar20 + 1;
                } while (bVar24);
              }
              if (bVar23) {
                unmark_long_term_field_for_reference_by_frame_idx
                          (p_Dpb,(RK_S32)pcVar14,uVar1,0,0,iVar15);
              }
              else if (((byte)h264d_debug & 4) != 0) {
                pcVar14 = "h264d_dpb";
                _mpp_log_l(4,"h264d_dpb","value error(%d).\n",(char *)0x0);
              }
              if (bVar23) goto LAB_001937df;
            }
LAB_001938e3:
            update_ref_list(p_Dpb);
            goto LAB_001938eb;
          case 4:
            pcVar14 = (char *)(ulong)(uint)phVar4->max_long_term_frame_idx_plus1;
            mm_update_max_long_term_frame_idx(p_Dpb,phVar4->max_long_term_frame_idx_plus1);
LAB_001938eb:
            update_ltref_list(p_Dpb);
            break;
          case 5:
            if (p_Dpb->ref_frames_in_buffer != 0) {
              uVar16 = 0;
              do {
                unmark_for_reference
                          ((H264_DecCtx_t *)p_Dpb->fs_ref[uVar16],(H264_FrameStore_t *)pcVar14);
                uVar16 = uVar16 + 1;
              } while (uVar16 < p_Dpb->ref_frames_in_buffer);
            }
            update_ref_list(p_Dpb);
            pcVar14 = (char *)0x0;
            mm_update_max_long_term_frame_idx(p_Dpb,0);
            phVar3->last_has_mmco_5 = 1;
            break;
          case 6:
            if (phVar4->max_long_term_frame_idx_plus1 == 0) {
              phVar4->max_long_term_frame_idx_plus1 = p_Dpb->num_ref_frames;
            }
            uVar1 = phVar4->long_term_frame_idx;
            phVar17 = (h264_store_pic_t *)(ulong)uVar1;
            uVar12 = p->structure;
            pcVar14 = (char *)(ulong)uVar12;
            if (uVar12 == 3) {
              unmark_long_term_frame_for_reference_by_frame_idx(p_Dpb,uVar1);
              pcVar14 = (char *)phVar17;
            }
            else {
              unmark_long_term_field_for_reference_by_frame_idx(p_Dpb,uVar12,uVar1,1,p->pic_num,0);
            }
            p->is_long_term = '\x01';
            p->long_term_frame_idx = uVar1;
            iVar15 = p_Dpb->num_ref_frames;
            if (iVar15 < 2) {
              iVar15 = 1;
            }
            if ((iVar15 < (int)(p_Dpb->ref_frames_in_buffer + p_Dpb->ltref_frames_in_buffer)) &&
               (sliding_window_memory_management(p_Dpb), ((byte)h264d_debug & 4) != 0)) {
              pcVar14 = "h264d_dpb";
              _mpp_log_l(4,"h264d_dpb","Max number of reference frames exceeded",(char *)0x0);
            }
            break;
          default:
            MVar7 = MPP_NOK;
            goto LAB_00193c10;
          }
          phVar4 = phVar4->Next;
          p->dec_ref_pic_marking_buffer = phVar4;
        }
        RVar9 = (RK_S32)pcVar14;
        if (phVar3->last_has_mmco_5 == 0) {
LAB_00193c0d:
          MVar7 = MPP_OK;
        }
        else {
          p->frame_num = 0;
          p->pic_num = 0;
          iVar15 = p->structure;
          if (iVar15 == 3) {
            p->is_mmco_5 = '\x01';
            iVar15 = p->top_poc;
            p->top_poc_mmco5 = iVar15;
            iVar22 = p->bottom_poc;
            p->bot_poc_mmco5 = iVar22;
            RVar9 = iVar15 - p->poc;
            iVar19 = iVar22 - p->poc;
            iVar13 = iVar22;
            if (iVar15 < iVar22) {
              iVar13 = iVar15;
            }
            p->poc_mmco5 = iVar13;
            p->top_poc = RVar9;
            p->bottom_poc = iVar19;
            if (iVar15 <= iVar22) {
              iVar19 = RVar9;
            }
            p->poc = iVar19;
            p->frame_poc = iVar19;
          }
          else if (iVar15 == 2) {
            p->is_mmco_5 = '\x01';
            p->bot_poc_mmco5 = p->bottom_poc;
            p->bottom_poc = 0;
            p->poc = 0;
          }
          else if (iVar15 == 1) {
            p->is_mmco_5 = '\x01';
            p->top_poc_mmco5 = p->top_poc;
            p->poc = 0;
            p->top_poc = 0;
          }
          if (p->layer_id == 0) {
            MVar7 = flush_dpb(phVar3->p_Dpb_layer[0],RVar9);
            if (MPP_NOK < MVar7) goto LAB_00193c0d;
            if (((byte)h264d_debug & 4) != 0) {
              pcVar14 = "Function error(%d).\n";
              uVar21 = 0x470;
              goto LAB_001941a0;
            }
          }
          else {
            MVar7 = flush_dpb(phVar3->p_Dpb_layer[1],RVar9);
            if (MPP_NOK < MVar7) goto LAB_00193c0d;
            if (((byte)h264d_debug & 4) != 0) {
              pcVar14 = "Function error(%d).\n";
              uVar21 = 0x472;
LAB_001941a0:
              _mpp_log_l(4,"h264d_dpb",pcVar14,(char *)0x0,uVar21);
            }
          }
        }
LAB_00193c10:
        if (MVar7 < MPP_OK) {
          if (((byte)h264d_debug & 4) == 0) goto LAB_00193313;
          pcVar14 = "Function error(%d).\n";
          uVar21 = 0x5ab;
          goto LAB_0019330c;
        }
      }
    }
    else {
      MVar7 = idr_memory_management(p_Dpb,p);
      if (MVar7 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) goto LAB_00193313;
        pcVar14 = "Function error(%d).\n";
        uVar21 = 0x5a8;
        goto LAB_0019330c;
      }
    }
    RVar8 = get_field_dpb_combine_flag(p_Dpb->last_picture,p);
    if (RVar8 == 0) {
      if (((p->idr_flag == 0) && (p->used_for_reference != 0)) &&
         (p->adaptive_ref_pic_buffering_flag == 0)) {
        sliding_window_memory_management(p_Dpb);
        p->is_long_term = '\0';
      }
      do {
        MVar7 = remove_unused_frame_from_dpb(p_Dpb);
      } while (MVar7 == MPP_OK);
      if ((h264d_debug._1_1_ & 1) != 0) {
        _mpp_log_l(4,"h264d_dpb","before out, dpb[%d] used_size %d, size %d",(char *)0x0,
                   (ulong)(uint)p_Dpb->layer_id,(ulong)p_Dpb->used_size,p_Dpb->size);
      }
      uVar1 = p_Vid->p_Inp->max_buf_size;
      if ((uVar1 != 0) && ((h264d_debug._1_1_ & 1) != 0)) {
        _mpp_log_l(4,"h264d_dpb","max_buf_size=%d\n",(char *)0x0,(ulong)uVar1);
      }
      do {
        uVar12 = p_Dpb->used_size;
        if (uVar12 <= uVar1 - 1 && uVar12 < p_Dpb->size) {
          if ((h264d_debug._1_1_ & 1) != 0) {
            _mpp_log_l(4,"h264d_dpb","after out, dpb[%d] used_size %d, size %d",(char *)0x0,
                       (ulong)(uint)p_Dpb->layer_id,(ulong)uVar12,p_Dpb->size);
          }
          MVar7 = insert_picture_in_dpb(p_Vid,p_Dpb->fs[p_Dpb->used_size],p,'\0');
          if (MPP_NOK < MVar7) {
            if (p->structure == 3) {
              phVar11 = (h264_frame_store_t *)0x0;
            }
            else {
              phVar11 = p_Dpb->fs[p_Dpb->used_size];
            }
            p_Dpb->last_picture = phVar11;
            memcpy(&p_Vid->old_pic,p,0xe0);
            p_Vid->last_pic = &p_Vid->old_pic;
            p_Dpb->used_size = p_Dpb->used_size + 1;
            if ((h264d_debug._1_1_ & 1) != 0) {
              pcVar14 = "h264d_dpb";
              _mpp_log_l(4,"h264d_dpb","[DPB_size] p_Dpb->used_size=%d",(char *)0x0);
              p = (H264_StorePic_t *)pcVar14;
            }
            if (p_Vid->p_Dec->mvc_valid == '\0') {
              scan_dpb_output(p_Dpb,p);
            }
            update_ref_list(p_Dpb);
            update_ltref_list(p_Dpb);
            return MPP_OK;
          }
          if (((byte)h264d_debug & 4) == 0) goto LAB_00193313;
          pcVar14 = "Function error(%d).\n";
          uVar21 = 0x5e6;
          goto LAB_0019330c;
        }
        _local_40 = (MppFrame)((ulong)_local_40 & 0xffffffff00000000);
        local_34 = 0;
        remove_unused_frame_from_dpb(p_Dpb);
        pHVar18 = (H264_FrameStore_t *)&stack0xffffffffffffffc0;
        RVar9 = get_smallest_poc(p_Dpb,(RK_S32 *)pHVar18,&stack0xffffffffffffffcc);
        if ((p->used_for_reference == 0) && ((RVar9 == 0 || (p->poc < local_40)))) {
          MVar7 = direct_output(p_Vid,p_Dpb,p);
          iVar15 = 0x19;
          if ((MVar7 < MPP_OK) && (iVar15 = 6, ((byte)h264d_debug & 4) != 0)) {
            uVar21 = 0x5d1;
LAB_00193f10:
            iVar15 = 6;
            _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,uVar21);
          }
        }
        else if ((RVar9 == 0) || (p->poc < local_40)) {
          local_34 = 0;
          unmark_for_reference((H264_DecCtx_t *)*p_Dpb->fs,pHVar18);
          if ((*p_Dpb->fs)->is_output == 0) {
            if (((byte)h264d_debug & 4) != 0) {
              _mpp_log_l(4,"h264d_dpb","write_stored_frame, line %d",(char *)0x0,0x5da);
            }
            MVar7 = write_stored_frame(p_Vid,p_Dpb,*p_Dpb->fs);
            if (MVar7 < MPP_OK) {
              iVar15 = 6;
              if (((byte)h264d_debug & 4) != 0) {
                uVar21 = 0x5db;
                goto LAB_00193f10;
              }
              goto LAB_00193f17;
            }
          }
          MVar7 = remove_frame_from_dpb(p_Dpb,0);
          if (MVar7 < MPP_OK) {
            iVar15 = 6;
            if (((byte)h264d_debug & 4) != 0) {
              uVar21 = 0x5dd;
              goto LAB_00193f10;
            }
          }
          else {
            p->is_long_term = '\0';
            iVar15 = 0;
          }
        }
        else {
          MVar10 = output_one_frame_from_dpb(p_Dpb);
          iVar15 = 0;
          MVar7 = MPP_OK;
          if ((MVar10 < MPP_OK) && (iVar15 = 6, MVar7 = MVar10, ((byte)h264d_debug & 4) != 0)) {
            _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x5e0);
          }
        }
LAB_00193f17:
      } while (iVar15 == 0);
      if (iVar15 != 6) {
        return MPP_OK;
      }
      goto LAB_00193313;
    }
    p_00 = (H264_StorePic_t *)p_Dpb->last_picture;
    if (*(RK_U32 *)&p_00->top_field == 0) {
      MVar7 = insert_picture_in_dpb(p_Vid,(H264_FrameStore_t *)p_00,p,'\x01');
      if (MPP_NOK < MVar7) {
        scan_dpb_output(p_Dpb,p_00);
        goto LAB_00193f51;
      }
      if (((byte)h264d_debug & 4) == 0) goto LAB_00193313;
      pcVar14 = "Function error(%d).\n";
      uVar21 = 0x5b3;
    }
    else {
      MVar7 = direct_output(p_Vid,p_Dpb,p);
      if (MPP_NOK < MVar7) {
LAB_00193f51:
        memcpy(&p_Vid->old_pic,p,0xe0);
        p_Vid->last_pic = &p_Vid->old_pic;
        p_Dpb->last_picture = (h264_frame_store_t *)0x0;
        return MPP_OK;
      }
      if (((byte)h264d_debug & 4) == 0) goto LAB_00193313;
      pcVar14 = "Function error(%d).\n";
      uVar21 = 0x5b1;
    }
  }
LAB_0019330c:
  _mpp_log_l(4,"h264d_dpb",pcVar14,(char *)0x0,uVar21);
LAB_00193313:
  p_mark = p->mem_mark;
  if (p_mark != (H264_DpbMark_t *)0x0) {
    if ((p_mark->out_flag == 0) || (p_mark->slot_idx < 0)) {
      if (((byte)h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_dpb","out_flag %d slot_idx %d\n",(char *)0x0,(ulong)p_mark->out_flag,
                   (ulong)(uint)p_mark->slot_idx);
      }
    }
    else {
      phVar2 = p_Vid->p_Dec;
      _local_40 = (MppFrame)0x0;
      mpp_buf_slot_get_prop
                (phVar2->frame_slots,p_mark->slot_idx,SLOT_FRAME_PTR,&stack0xffffffffffffffc0);
      if (_local_40 != (MppFrame)0x0) {
        if ((h264d_debug._1_1_ & 0x20) != 0) {
          _mpp_log_l(4,"h264d_dpb","[DPB_BUF_FLUSH] slot_idx=%d, top_used=%d, bot_used=%d",
                     (char *)0x0,(ulong)(uint)p_mark->slot_idx,(ulong)p_mark->top_used,
                     (uint)p_mark->bot_used);
        }
        mpp_frame_set_discard(_local_40,1);
        mpp_buf_slot_set_flag(phVar2->frame_slots,p_mark->slot_idx,SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(phVar2->frame_slots,p_mark->slot_idx,QUEUE_DISPLAY);
        mpp_buf_slot_clr_flag(phVar2->frame_slots,p_mark->slot_idx,SLOT_CODEC_USE);
        phVar2->last_frame_slot_idx = p_mark->slot_idx;
      }
      reset_dpb_mark(p_mark);
    }
  }
  return MVar7;
}

Assistant:

MPP_RET store_picture_in_dpb(H264_DpbBuf_t *p_Dpb, H264_StorePic_t *p)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dVideoCtx_t *p_Vid = p_Dpb->p_Vid;
    RK_U32 max_buf_size = 0;

    VAL_CHECK(ret, NULL != p);  //!< if frame, check for new store
    //!< set use flag
    if (p->mem_mark && (p->mem_mark->slot_idx >= 0)) {
        mpp_buf_slot_set_flag(p_Vid->p_Dec->frame_slots, p->mem_mark->slot_idx, SLOT_CODEC_USE);
    } else {
        H264D_ERR("error, p->mem_mark == NULL");
    }
    //!< deal with all frames in dpb
    p_Vid->last_has_mmco_5 = 0;
    p_Vid->last_pic_bottom_field = p->structure == BOTTOM_FIELD;
    if (p->idr_flag) {
        FUN_CHECK(ret = idr_memory_management(p_Dpb, p));
    } else {    //!< adaptive memory management
        if (p->used_for_reference && p->adaptive_ref_pic_buffering_flag) {
            FUN_CHECK(ret = adaptive_memory_management(p_Dpb, p));
        }
    }
    //!< if necessary, combine top and botteom to frame
    if (get_field_dpb_combine_flag(p_Dpb->last_picture, p)) {
        if (p_Dpb->last_picture->is_directout) {
            FUN_CHECK(ret = direct_output(p_Vid, p_Dpb, p));  //!< output frame
        } else {
            FUN_CHECK(ret = insert_picture_in_dpb(p_Vid, p_Dpb->last_picture, p, 1));  //!< field_dpb_combine
            scan_dpb_output(p_Dpb, p);
        }
        memcpy(&p_Vid->old_pic, p, sizeof(H264_StorePic_t));
        p_Vid->last_pic = &p_Vid->old_pic;
        p_Dpb->last_picture = NULL;
        goto __RETURN;
    }
    //!< sliding window
    if (!p->idr_flag && p->used_for_reference && !p->adaptive_ref_pic_buffering_flag) {
        ASSERT(!p->idr_flag);
        sliding_window_memory_management(p_Dpb);
        p->is_long_term = 0;
    }
    while (!remove_unused_frame_from_dpb(p_Dpb));
    H264D_DBG(H264D_DBG_DPB_INFO, "before out, dpb[%d] used_size %d, size %d",
              p_Dpb->layer_id, p_Dpb->used_size, p_Dpb->size);
    //!< when full output one frame or more then setting max_buf_size
    max_buf_size = p_Vid->p_Inp->max_buf_size;
    if (max_buf_size)
        H264D_DBG(H264D_DBG_DPB_INFO, "max_buf_size=%d\n", max_buf_size);
    while (p_Dpb->used_size >= p_Dpb->size ||
           (max_buf_size && p_Dpb->used_size >= max_buf_size)) {
        RK_S32 min_poc = 0, min_pos = 0;
        RK_S32 find_flag = 0;

        remove_unused_frame_from_dpb(p_Dpb);
        find_flag = get_smallest_poc(p_Dpb, &min_poc, &min_pos);
        if (!p->used_for_reference) {
            if ((!find_flag) || (p->poc < min_poc)) {
                FUN_CHECK(ret = direct_output(p_Vid, p_Dpb, p));  //!< output frame
                goto __RETURN;
            }
        }
        //!< used for reference, but not find, then flush a frame in the first
        if ((!find_flag) || (p->poc < min_poc)) {
            min_pos = 0;
            unmark_for_reference(p_Vid->p_Dec, p_Dpb->fs[min_pos]);
            if (!p_Dpb->fs[min_pos]->is_output) {
                H264D_WARNNING("write_stored_frame, line %d", __LINE__);
                FUN_CHECK(ret = write_stored_frame(p_Vid, p_Dpb, p_Dpb->fs[min_pos]));
            }
            FUN_CHECK(ret = remove_frame_from_dpb(p_Dpb, min_pos));
            p->is_long_term = 0;
        } else {
            FUN_CHECK(ret = output_one_frame_from_dpb(p_Dpb));
        }
    }
    H264D_DBG(H264D_DBG_DPB_INFO, "after out, dpb[%d] used_size %d, size %d",
              p_Dpb->layer_id, p_Dpb->used_size, p_Dpb->size);
    //!< store current decoder picture at end of dpb
    FUN_CHECK(ret = insert_picture_in_dpb(p_Vid, p_Dpb->fs[p_Dpb->used_size], p, 0));
    if (p->structure != FRAME) {
        p_Dpb->last_picture = p_Dpb->fs[p_Dpb->used_size];
    } else {
        p_Dpb->last_picture = NULL;
    }
    memcpy(&p_Vid->old_pic, p, sizeof(H264_StorePic_t));
    p_Vid->last_pic = &p_Vid->old_pic;

    p_Dpb->used_size++;
    H264D_DBG(H264D_DBG_DPB_INFO, "[DPB_size] p_Dpb->used_size=%d", p_Dpb->used_size);
    if (!p_Vid->p_Dec->mvc_valid)
        scan_dpb_output(p_Dpb, p);
    update_ref_list(p_Dpb);
    update_ltref_list(p_Dpb);

__RETURN:
    return ret = MPP_OK;
__FAILED:
    flush_one_dpb_mark(p_Vid->p_Dec, p->mem_mark);
    return ret;
}